

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

QString * llvmReadobjPath(Options *options)

{
  QAnyStringView s;
  QAnyStringView s_00;
  QAnyStringView s_01;
  QString *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar1;
  ArgBase *argBases [4];
  QString *in_stack_fffffffffffffe68;
  QAnyStringView *in_stack_fffffffffffffe78;
  QString *str;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 in_stack_fffffffffffffe80;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 this;
  char *in_stack_fffffffffffffe88;
  undefined1 *puVar2;
  qsizetype local_108;
  char *pcStack_100;
  undefined1 local_f8 [40];
  undefined1 local_d0 [40];
  undefined1 local_a8 [40];
  QString local_80;
  qsizetype local_68;
  char *pcStack_60;
  ulong local_58;
  ArgBase **local_50;
  ulong local_48;
  ArgBase **ppAStack_40;
  ulong local_38;
  ArgBase **ppAStack_30;
  QString *local_28;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aStack_20;
  undefined1 *local_18;
  undefined8 uStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QVar1 = Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_stack_fffffffffffffe78,(size_t)in_RDI);
  local_108 = QVar1.m_size;
  local_68 = local_108;
  pcStack_100 = QVar1.m_data;
  pcStack_60 = pcStack_100;
  QVar1.m_data = in_stack_fffffffffffffe88;
  QVar1.m_size = (qsizetype)in_stack_fffffffffffffe80.m_data;
  QAnyStringView::QAnyStringView(in_stack_fffffffffffffe78,QVar1);
  QAnyStringView::QAnyStringView
            ((QAnyStringView *)in_stack_fffffffffffffe80.m_data,(QString *)in_stack_fffffffffffffe78
            );
  str = &local_80;
  s.m_size = (size_t)in_stack_fffffffffffffe88;
  s.field_0.m_data = in_stack_fffffffffffffe80.m_data;
  QtPrivate::qStringLikeToArg(s);
  QAnyStringView::QAnyStringView((QAnyStringView *)in_stack_fffffffffffffe80.m_data,str);
  this.m_data = local_a8;
  s_00.m_size = (size_t)in_stack_fffffffffffffe88;
  s_00.field_0.m_data = this.m_data;
  QtPrivate::qStringLikeToArg(s_00);
  QAnyStringView::QAnyStringView((QAnyStringView *)this.m_data,str);
  puVar2 = local_d0;
  s_01.m_size = (size_t)puVar2;
  s_01.field_0.m_data = this.m_data;
  QtPrivate::qStringLikeToArg(s_01);
  local_38 = local_58;
  ppAStack_30 = local_50;
  uStack_10 = 0;
  local_48 = local_58;
  ppAStack_40 = local_50;
  local_28 = str;
  aStack_20 = this;
  local_18 = puVar2;
  QtPrivate::argToQString((QAnyStringView *)local_f8,local_58,local_50);
  execSuffixAppended(in_stack_fffffffffffffe68);
  QString::~QString((QString *)0x10a060);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static QString llvmReadobjPath(const Options &options)
{
    return execSuffixAppended("%1/toolchains/%2/prebuilt/%3/bin/llvm-readobj"_L1
                              .arg(options.ndkPath,
                                   options.toolchainPrefix,
                                   options.ndkHost));
}